

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::SetRepartitionRadixBits
          (JoinHashTable *this,idx_t max_ht_size,idx_t max_partition_size,idx_t max_partition_count)

{
  idx_t iVar1;
  BufferManager *args;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var2;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var3;
  long lVar4;
  ulong uVar5;
  idx_t iVar6;
  TupleDataLayout *pTVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  unsigned_long local_30;
  
  iVar1 = this->radix_bits;
  auVar10._8_4_ = (int)(max_partition_size >> 0x20);
  auVar10._0_8_ = max_partition_size;
  auVar10._12_4_ = 0x45300000;
  dStack_50 = auVar10._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)max_partition_size) - 4503599627370496.0)
  ;
  auVar11._8_4_ = (int)(max_partition_count >> 0x20);
  auVar11._0_8_ = max_partition_count;
  auVar11._12_4_ = 0x45300000;
  dStack_70 = auVar11._8_8_ - 1.9342813113834067e+25;
  auVar14._8_4_ = (int)(max_ht_size >> 0x20);
  auVar14._0_8_ = max_ht_size;
  auVar14._12_4_ = 0x45300000;
  dStack_60 = auVar14._8_8_ - 1.9342813113834067e+25;
  local_68 = (dStack_60 + ((double)CONCAT44(0x43300000,(int)max_ht_size) - 4503599627370496.0)) *
             0.25;
  local_78 = dStack_70 +
             ((double)CONCAT44(0x43300000,(int)max_partition_count) - 4503599627370496.0);
  for (uVar8 = 1; uVar8 < 0xc - iVar1; uVar8 = uVar8 + 1) {
    lVar4 = 1L << ((byte)uVar8 & 0x3f);
    auVar12._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar12._0_8_ = lVar4;
    auVar12._12_4_ = 0x45300000;
    local_48 = (auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    dVar9 = local_78 / local_48;
    uVar5 = (ulong)dVar9;
    local_48 = local_58 / local_48;
    dStack_40 = dStack_50;
    iVar6 = PointerTableSize(this,(long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f |
                                  uVar5);
    auVar13._8_4_ = (int)(iVar6 >> 0x20);
    auVar13._0_8_ = iVar6;
    auVar13._12_4_ = 0x45300000;
    if ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)iVar6) - 4503599627370496.0) + local_48 <= local_68)
    break;
  }
  this->radix_bits = this->radix_bits + uVar8;
  args = this->buffer_manager;
  pTVar7 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(&this->layout_ptr);
  local_30 = ((long)(pTVar7->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar7->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1;
  make_uniq<duckdb::RadixPartitionedTupleData,duckdb::BufferManager&,duckdb::shared_ptr<duckdb::TupleDataLayout,true>&,unsigned_long&,unsigned_long>
            ((duckdb *)&local_80,args,&this->layout_ptr,&this->radix_bits,&local_30);
  _Var3._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (PartitionedTupleData *)0x0;
  _Var2._M_head_impl =
       (this->sink_collection).
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  (this->sink_collection).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (PartitionedTupleData *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_PartitionedTupleData + 8))();
    if (local_80._M_head_impl != (PartitionedTupleData *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  InitializePartitionMasks(this);
  return;
}

Assistant:

void JoinHashTable::SetRepartitionRadixBits(const idx_t max_ht_size, const idx_t max_partition_size,
                                            const idx_t max_partition_count) {
	D_ASSERT(max_partition_size + PointerTableSize(max_partition_count) > max_ht_size);

	const auto max_added_bits = RadixPartitioning::MAX_RADIX_BITS - radix_bits;
	idx_t added_bits = 1;
	for (; added_bits < max_added_bits; added_bits++) {
		double partition_multiplier = static_cast<double>(RadixPartitioning::NumberOfPartitions(added_bits));

		auto new_estimated_size = static_cast<double>(max_partition_size) / partition_multiplier;
		auto new_estimated_count = static_cast<double>(max_partition_count) / partition_multiplier;
		auto new_estimated_ht_size =
		    new_estimated_size + static_cast<double>(PointerTableSize(LossyNumericCast<idx_t>(new_estimated_count)));

		if (new_estimated_ht_size <= static_cast<double>(max_ht_size) / 4) {
			// Aim for an estimated partition size of max_ht_size / 4
			break;
		}
	}
	radix_bits += added_bits;
	sink_collection =
	    make_uniq<RadixPartitionedTupleData>(buffer_manager, layout_ptr, radix_bits, layout_ptr->ColumnCount() - 1);

	// Need to initialize again after changing the number of bits
	InitializePartitionMasks();
}